

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

bool bsim::operator>(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  bool bVar1;
  undefined8 in_RAX;
  byte bVar2;
  undefined8 in_RCX;
  int iVar3;
  ulong uVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  bVar1 = quad_value_bit_vector::is_binary(a);
  if ((!bVar1) || (bVar1 = quad_value_bit_vector::is_binary(b), !bVar1)) {
    return false;
  }
  uVar4 = (ulong)(uint)a->N;
  do {
    bVar2 = (byte)in_RCX;
    iVar3 = (int)uVar4;
    if (iVar3 < 1) goto LAB_00143f57;
    uStack_38 = CONCAT17((a->bits).
                         super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar4 - 1].value,
                         CONCAT16((b->bits).
                                  super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1].value,
                                  (undefined6)uStack_38));
    bVar1 = operator>((quad_value *)((long)&uStack_38 + 7),(quad_value *)((long)&uStack_38 + 6));
    if (bVar1) {
      bVar2 = 1;
      goto LAB_00143f57;
    }
    uStack_38 = CONCAT35(CONCAT21(uStack_38._6_2_,
                                  (a->bits).
                                  super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1].value),
                         CONCAT14((b->bits).
                                  super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1].value,
                                  (undefined4)uStack_38));
    bVar1 = operator<((quad_value *)((long)&uStack_38 + 5),(quad_value *)((long)&uStack_38 + 4));
    uVar4 = uVar4 - 1;
  } while (!bVar1);
  bVar2 = 0;
LAB_00143f57:
  return (bool)(0 < iVar3 & bVar2);
}

Assistant:

static inline bool operator>(const quad_value_bit_vector& a,
  			       const quad_value_bit_vector& b) {
    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }

    int N = a.bitLength();
    for (int i = N - 1; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;
  }